

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_chk(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  ushort uVar1;
  TCGv_i32 pTVar2;
  int iVar3;
  uint32_t dest;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  TCGv_i32 local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = insn >> 7 & 3;
  if (uVar1 == 3) {
    iVar3 = 1;
  }
  else if ((uVar1 != 2) || (iVar3 = 2, (env->features & 0x2000000) == 0)) {
    dest = (s->base).pc_next;
    iVar3 = 4;
    goto LAB_006f8247;
  }
  local_38 = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,iVar3,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,
                         EA_LOADS,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (local_38 != tcg_ctx->NULL_QREG) {
    pTVar2 = gen_extend(s,*(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + (ulong)(insn >> 6 & 0x38)),iVar3,
                        1);
    gen_flush_flags(s);
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = pTVar2 + (long)tcg_ctx;
    local_38 = local_38 + (long)tcg_ctx;
    tcg_gen_callN_m68k(tcg_ctx,helper_chk_m68k,(TCGTemp *)0x0,3,&local_48);
    return;
  }
  dest = (s->base).pc_next;
  iVar3 = 3;
LAB_006f8247:
  gen_exception(s,dest,iVar3);
  return;
}

Assistant:

DISAS_INSN(chk)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src, reg;
    int opsize;

    switch ((insn >> 7) & 3) {
    case 3:
        opsize = OS_WORD;
        break;
    case 2:
        if (m68k_feature(env, M68K_FEATURE_CHK2)) {
            opsize = OS_LONG;
            break;
        }
        /* fallthru */
    default:
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
        return;
    }
    SRC_EA(env, src, opsize, 1, NULL);
    reg = gen_extend(s, DREG(insn, 9), opsize, 1);

    gen_flush_flags(s);
    gen_helper_chk(tcg_ctx, tcg_ctx->cpu_env, reg, src);
}